

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

cgltf_size cgltf_component_read_index(void *in,cgltf_component_type component_type)

{
  ulong uVar1;
  
  switch(component_type) {
  case cgltf_component_type_r_8:
    return (long)*in;
  case cgltf_component_type_r_8u:
    return (ulong)*in;
  case cgltf_component_type_r_16:
    return (long)*in;
  case cgltf_component_type_r_16u:
    return (ulong)*in;
  case cgltf_component_type_r_32u:
    return (ulong)*in;
  case cgltf_component_type_r_32f:
    uVar1 = (ulong)*in;
    return (long)(*in - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1;
  default:
    return 0;
  }
}

Assistant:

static cgltf_size cgltf_component_read_index(const void* in, cgltf_component_type component_type)
{
    switch (component_type)
    {
        case cgltf_component_type_r_16:
            return *((const int16_t*) in);
        case cgltf_component_type_r_16u:
            return *((const uint16_t*) in);
        case cgltf_component_type_r_32u:
            return *((const uint32_t*) in);
        case cgltf_component_type_r_32f:
            return (cgltf_size)*((const float*) in);
        case cgltf_component_type_r_8:
            return *((const int8_t*) in);
        case cgltf_component_type_r_8u:
            return *((const uint8_t*) in);
        default:
            return 0;
    }
}